

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O0

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_1> *lhs,
          const_blas_data_mapper<double,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ResScalar *pRVar5;
  long lVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  undefined4 extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dc_23;
  undefined4 extraout_XMM0_Dc_24;
  undefined4 extraout_XMM0_Dc_25;
  undefined4 extraout_XMM0_Dc_26;
  undefined4 extraout_XMM0_Dc_27;
  undefined4 extraout_XMM0_Dc_28;
  undefined4 extraout_XMM0_Dc_29;
  undefined4 extraout_XMM0_Dc_30;
  undefined4 extraout_XMM0_Dc_31;
  undefined4 extraout_XMM0_Dc_32;
  undefined4 extraout_XMM0_Dc_33;
  undefined4 extraout_XMM0_Dc_34;
  undefined4 extraout_XMM0_Dc_35;
  undefined4 extraout_XMM0_Dc_36;
  undefined4 extraout_XMM0_Dc_37;
  undefined4 extraout_XMM0_Dc_38;
  undefined4 extraout_XMM0_Dc_39;
  undefined4 extraout_XMM0_Dc_40;
  undefined4 extraout_XMM0_Dc_41;
  undefined4 extraout_XMM0_Dc_42;
  undefined4 extraout_XMM0_Dc_43;
  undefined4 extraout_XMM0_Dc_44;
  undefined4 extraout_XMM0_Dc_45;
  undefined4 extraout_XMM0_Dc_46;
  undefined4 extraout_XMM0_Dc_47;
  undefined4 extraout_XMM0_Dc_48;
  undefined4 extraout_XMM0_Dc_49;
  undefined4 extraout_XMM0_Dc_50;
  undefined4 extraout_XMM0_Dc_51;
  undefined4 extraout_XMM0_Dc_52;
  undefined4 extraout_XMM0_Dc_53;
  undefined4 extraout_XMM0_Dc_54;
  undefined4 extraout_XMM0_Dc_55;
  undefined4 extraout_XMM0_Dc_56;
  undefined4 extraout_XMM0_Dc_57;
  undefined4 extraout_XMM0_Dc_58;
  undefined4 extraout_XMM0_Dc_59;
  undefined4 extraout_XMM0_Dc_60;
  undefined4 extraout_XMM0_Dc_61;
  undefined4 extraout_XMM0_Dc_62;
  undefined4 extraout_XMM0_Dc_63;
  undefined4 extraout_XMM0_Dc_64;
  undefined4 extraout_XMM0_Dc_65;
  undefined4 extraout_XMM0_Dc_66;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  undefined4 extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined4 extraout_XMM0_Dd_22;
  undefined4 extraout_XMM0_Dd_23;
  undefined4 extraout_XMM0_Dd_24;
  undefined4 extraout_XMM0_Dd_25;
  undefined4 extraout_XMM0_Dd_26;
  undefined4 extraout_XMM0_Dd_27;
  undefined4 extraout_XMM0_Dd_28;
  undefined4 extraout_XMM0_Dd_29;
  undefined4 extraout_XMM0_Dd_30;
  undefined4 extraout_XMM0_Dd_31;
  undefined4 extraout_XMM0_Dd_32;
  undefined4 extraout_XMM0_Dd_33;
  undefined4 extraout_XMM0_Dd_34;
  undefined4 extraout_XMM0_Dd_35;
  undefined4 extraout_XMM0_Dd_36;
  undefined4 extraout_XMM0_Dd_37;
  undefined4 extraout_XMM0_Dd_38;
  undefined4 extraout_XMM0_Dd_39;
  undefined4 extraout_XMM0_Dd_40;
  undefined4 extraout_XMM0_Dd_41;
  undefined4 extraout_XMM0_Dd_42;
  undefined4 extraout_XMM0_Dd_43;
  undefined4 extraout_XMM0_Dd_44;
  undefined4 extraout_XMM0_Dd_45;
  undefined4 extraout_XMM0_Dd_46;
  undefined4 extraout_XMM0_Dd_47;
  undefined4 extraout_XMM0_Dd_48;
  undefined4 extraout_XMM0_Dd_49;
  undefined4 extraout_XMM0_Dd_50;
  undefined4 extraout_XMM0_Dd_51;
  undefined4 extraout_XMM0_Dd_52;
  undefined4 extraout_XMM0_Dd_53;
  undefined4 extraout_XMM0_Dd_54;
  undefined4 extraout_XMM0_Dd_55;
  undefined4 extraout_XMM0_Dd_56;
  undefined4 extraout_XMM0_Dd_57;
  undefined4 extraout_XMM0_Dd_58;
  undefined4 extraout_XMM0_Dd_59;
  undefined4 extraout_XMM0_Dd_60;
  undefined4 extraout_XMM0_Dd_61;
  undefined4 extraout_XMM0_Dd_62;
  undefined4 extraout_XMM0_Dd_63;
  undefined4 extraout_XMM0_Dd_64;
  undefined4 extraout_XMM0_Dd_65;
  undefined4 extraout_XMM0_Dd_66;
  Packet2d adVar7;
  double adVar8 [2];
  uint local_d44;
  double local_d40;
  long local_d38;
  long j_9;
  double local_d28 [2];
  double local_d18 [2];
  long local_d08;
  long j_8;
  double local_cf8 [2];
  double local_ce8 [2];
  long local_cd8;
  long j_7;
  long local_cc8;
  long j_6;
  LhsScalars lhs0_1;
  ResPacket ptmp0_1;
  ResScalar tmp0_1;
  long i_1;
  long start;
  long end;
  double local_c80;
  double local_c78;
  double local_c70;
  double local_c68;
  double b_6;
  long j_5;
  double local_c48 [2];
  double local_c38 [2];
  double local_c28 [2];
  double *local_c10;
  undefined1 auStack_c08 [8];
  RhsPacket b_5;
  long local_bf0;
  long j_4;
  double local_bd8 [2];
  double local_bc8 [2];
  double local_bb8 [2];
  double *local_ba0;
  undefined1 auStack_b98 [8];
  RhsPacket b_4;
  double *local_b70;
  double local_b68 [2];
  double *local_b50;
  undefined1 auStack_b48 [8];
  RhsPacket b_3;
  LhsPacket A13;
  LhsPacket A12;
  LhsPacket A11;
  LhsPacket A03;
  LhsPacket A02;
  LhsPacket A01;
  long local_ad0;
  long j_3;
  double local_ab8 [2];
  double local_aa8 [2];
  double local_a98 [2];
  double *local_a80;
  undefined1 auStack_a78 [8];
  RhsPacket b_2;
  long local_a60;
  long j_2;
  double local_a48 [2];
  double local_a38 [2];
  double local_a28 [2];
  double *local_a10;
  undefined1 auStack_a08 [8];
  RhsPacket b_1;
  long j_1;
  double local_9e8;
  double local_9e0;
  double local_9d8;
  double local_9d0;
  double b;
  long j;
  undefined1 auStack_9b8 [8];
  ResPacket ptmp3;
  double local_9a0;
  undefined1 auStack_998 [8];
  ResPacket ptmp2;
  double local_980;
  undefined1 auStack_978 [8];
  ResPacket ptmp1;
  double local_960;
  undefined1 auStack_958 [8];
  ResPacket ptmp0;
  double *local_940;
  LhsScalars lhs3;
  LhsScalars lhs2;
  LhsScalars lhs1;
  LhsScalars lhs0;
  ResScalar tmp3;
  ResScalar tmp2;
  ResScalar tmp1;
  ResScalar tmp0;
  long i;
  long rowBound;
  long offset3;
  long offset1;
  ResScalar local_8d8;
  long skipRows;
  long rhsAlignmentOffset;
  long lhsAlignmentOffset;
  long alignmentPattern;
  long alignmentStep;
  long peeledSize;
  long alignedSize;
  long alignedStart;
  long lhsStride;
  long depth;
  long LhsPacketAlignedMask;
  long RhsPacketAlignedMask;
  long peels;
  long rowsAtOnce;
  conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
  pcj;
  ResScalar RStack_860;
  conj_helper<double,_double,_false,_false> cj;
  ResScalar alpha_local;
  long resIncr_local;
  ResScalar *res_local;
  const_blas_data_mapper<double,_long,_0> *rhs_local;
  const_blas_data_mapper<double,_long,_1> *lhs_local;
  long cols_local;
  long rows_local;
  undefined1 local_810 [8];
  undefined8 local_808;
  long local_800;
  const_blas_data_mapper<double,_long,_0> *local_7f8;
  undefined1 local_7f0 [8];
  undefined8 local_7e8;
  long local_7e0;
  const_blas_data_mapper<double,_long,_0> *local_7d8;
  undefined1 local_7d0 [8];
  undefined8 local_7c8;
  long local_7c0;
  const_blas_data_mapper<double,_long,_0> *local_7b8;
  undefined1 local_7b0 [8];
  undefined8 local_7a8;
  long local_7a0;
  const_blas_data_mapper<double,_long,_0> *local_798;
  undefined1 local_790 [8];
  undefined8 local_788;
  long local_780;
  const_blas_data_mapper<double,_long,_0> *local_778;
  undefined1 local_770 [8];
  undefined8 local_768;
  long local_760;
  const_blas_data_mapper<double,_long,_0> *local_758;
  undefined1 local_750 [8];
  undefined8 local_748;
  double local_740;
  const_blas_data_mapper<double,_long,_0> *local_738;
  undefined1 local_730 [8];
  long local_728;
  long *local_720;
  long local_718;
  long *local_710;
  double local_708;
  double **local_700;
  double local_6f8;
  LhsScalars *local_6f0;
  double local_6e8;
  LhsScalars *local_6e0;
  double local_6d8;
  LhsScalars *local_6d0;
  double local_6c8;
  double **local_6c0;
  double local_6b8;
  LhsScalars *local_6b0;
  double local_6a8;
  LhsScalars *local_6a0;
  double local_698;
  LhsScalars *local_690;
  undefined8 local_688;
  long *local_680;
  double *local_678;
  undefined8 local_670;
  long *local_668;
  double *local_660;
  long local_658;
  long *local_650;
  double *local_648;
  undefined8 local_640;
  double **local_638;
  double *local_630;
  long local_628;
  LhsScalars *local_620;
  double *local_618;
  undefined8 local_610;
  double **local_608;
  double *local_600;
  long local_5f8;
  LhsScalars *local_5f0;
  double *local_5e8;
  undefined8 local_5e0;
  double **local_5d8;
  double *local_5d0;
  long local_5c8;
  double **local_5c0;
  double *local_5b8;
  long local_5b0;
  LhsScalars *local_5a8;
  double *local_5a0;
  long local_598;
  LhsScalars *local_590;
  double *local_588;
  long local_580;
  LhsScalars *local_578;
  double *local_570;
  long local_568;
  double **local_560;
  double *local_558;
  long local_550;
  LhsScalars *local_548;
  double *local_540;
  long local_538;
  LhsScalars *local_530;
  double *local_528;
  undefined8 local_520;
  double **local_518;
  double *local_510;
  long local_508;
  double **local_500;
  double *local_4f8;
  long local_4f0;
  LhsScalars *local_4e8;
  double *local_4e0;
  long local_4d8;
  LhsScalars *local_4d0;
  double *local_4c8;
  long local_4c0;
  LhsScalars *local_4b8;
  double *local_4b0;
  long local_4a8;
  LhsScalars *local_4a0;
  double *local_498;
  undefined8 local_490;
  double **local_488;
  double *local_480;
  double local_478;
  double **local_470;
  double *local_468;
  double local_460;
  LhsScalars *local_458;
  double *local_450;
  double local_448;
  LhsScalars *local_440;
  double *local_438;
  double local_430;
  LhsScalars *local_428;
  double *local_420;
  undefined8 local_418;
  double **local_410;
  double *local_408;
  long local_400;
  long *local_3f8;
  double *local_3f0;
  long local_3e8;
  double **local_3e0;
  double *local_3d8;
  long local_3d0;
  LhsScalars *local_3c8;
  double *local_3c0;
  long local_3b8;
  LhsScalars *local_3b0;
  double *local_3a8;
  long local_3a0;
  LhsScalars *local_398;
  double *local_390;
  long local_388;
  double **local_380;
  double *local_378;
  long local_370;
  LhsScalars *local_368;
  double *local_360;
  long local_358;
  LhsScalars *local_350;
  double *local_348;
  long local_340;
  double **local_338;
  double *local_330;
  long local_328;
  LhsScalars *local_320;
  double *local_318;
  undefined8 local_310;
  double local_308;
  const_blas_data_mapper<double,_long,_0> *local_300;
  undefined8 local_2f8;
  long local_2f0;
  const_blas_data_mapper<double,_long,_0> *local_2e8;
  undefined8 local_2e0;
  long local_2d8;
  const_blas_data_mapper<double,_long,_0> *local_2d0;
  undefined8 local_2c8;
  long local_2c0;
  const_blas_data_mapper<double,_long,_0> *local_2b8;
  undefined8 local_2b0;
  long local_2a8;
  const_blas_data_mapper<double,_long,_0> *local_2a0;
  undefined8 local_298;
  long local_290;
  const_blas_data_mapper<double,_long,_0> *local_288;
  undefined8 local_280;
  long local_278;
  const_blas_data_mapper<double,_long,_0> *local_270;
  undefined8 local_268;
  long local_260;
  const_blas_data_mapper<double,_long,_0> *local_258;
  undefined8 local_250;
  long local_248;
  const_blas_data_mapper<double,_long,_0> *local_240;
  undefined8 local_238;
  long local_230;
  const_blas_data_mapper<double,_long,_0> *local_228;
  undefined8 local_220;
  double local_218;
  const_blas_data_mapper<double,_long,_0> *local_210;
  undefined8 local_208;
  double local_200;
  const_blas_data_mapper<double,_long,_0> *local_1f8;
  double *local_1f0;
  undefined1 *local_1e8;
  double *local_1e0;
  undefined1 *local_1d8;
  double *local_1d0;
  undefined1 *local_1c8;
  double *local_1c0;
  undefined1 *local_1b8;
  double *local_1b0;
  undefined1 *local_1a8;
  double *local_1a0;
  undefined1 *local_198;
  double *local_190;
  undefined1 *local_188;
  double *local_180;
  undefined1 *local_178;
  undefined8 local_170;
  ResScalar local_168;
  const_blas_data_mapper<double,_long,_1> *local_160;
  undefined1 local_158 [8];
  undefined8 local_150;
  ResScalar local_148;
  const_blas_data_mapper<double,_long,_1> *local_140;
  double *local_138;
  undefined1 *local_130;
  undefined8 local_128;
  long local_120;
  const_blas_data_mapper<double,_long,_1> *local_118;
  undefined1 local_110 [8];
  undefined8 local_108;
  long local_100;
  const_blas_data_mapper<double,_long,_1> *local_f8;
  double *local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  long local_d8;
  const_blas_data_mapper<double,_long,_1> *local_d0;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  long local_b8;
  const_blas_data_mapper<double,_long,_1> *local_b0;
  double *local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  long local_90;
  const_blas_data_mapper<double,_long,_1> *local_88;
  undefined1 local_80 [8];
  undefined8 local_78;
  long local_70;
  const_blas_data_mapper<double,_long,_1> *local_68;
  double *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  ResScalar local_48;
  const_blas_data_mapper<double,_long,_1> *local_40;
  undefined1 local_38 [8];
  undefined8 local_30;
  ResScalar local_28;
  const_blas_data_mapper<double,_long,_1> *local_20;
  double *local_18;
  undefined1 *local_10;
  
  peels = 4;
  RhsPacketAlignedMask = 2;
  LhsPacketAlignedMask = 1;
  depth = 1;
  lhsStride = cols;
  RStack_860 = alpha;
  alignedStart = blas_data_mapper<const_double,_long,_1,_0>::stride
                           (&lhs->super_blas_data_mapper<const_double,_long,_1,_0>);
  alignedSize = blas_data_mapper<const_double,_long,_0,_0>::firstAligned
                          (&rhs->super_blas_data_mapper<const_double,_long,_0,_0>,lhsStride);
  peeledSize = alignedSize + (lhsStride - alignedSize & 0xfffffffffffffffeU);
  alignmentStep = peeledSize + -5;
  alignmentPattern = 2U - alignedStart % 2 & 1;
  if (alignmentPattern == 0) {
    local_d44 = 0;
  }
  else {
    local_d44 = 2;
    if (alignmentPattern == 1) {
      local_d44 = 1;
    }
  }
  lhsAlignmentOffset = (long)local_d44;
  rhsAlignmentOffset =
       blas_data_mapper<const_double,_long,_1,_0>::firstAligned
                 (&lhs->super_blas_data_mapper<const_double,_long,_1,_0>,lhsStride);
  skipRows = blas_data_mapper<const_double,_long,_0,_0>::firstAligned
                       (&rhs->super_blas_data_mapper<const_double,_long,_0,_0>,rows);
  local_8d8 = 0.0;
  if ((((rhsAlignmentOffset < 0) || (rhsAlignmentOffset == lhsStride)) || (skipRows < 0)) ||
     (skipRows == rows)) {
    peeledSize = 0;
    alignedSize = 0;
    lhsAlignmentOffset = 3;
  }
  else {
    for (; (long)local_8d8 < 2 &&
           alignedSize != (rhsAlignmentOffset + alignmentPattern * (long)local_8d8) % 2;
        local_8d8 = (ResScalar)((long)local_8d8 + 1)) {
    }
    if (local_8d8 == 9.88131291682493e-324) {
      lhsAlignmentOffset = 3;
      local_8d8 = 0.0;
    }
    else {
      offset1 = rows;
      pRVar5 = (ResScalar *)std::min<long>((long *)&local_8d8,&offset1);
      local_8d8 = *pRVar5;
    }
  }
  iVar3 = 1;
  if (lhsAlignmentOffset == 2 && alignmentPattern == 1) {
    iVar3 = 3;
  }
  iVar4 = 3;
  if (lhsAlignmentOffset == 2 && alignmentPattern == 1) {
    iVar4 = 1;
  }
  i_1 = ((rows - (long)local_8d8) / 4) * 4 + (long)local_8d8;
  for (tmp0 = local_8d8; start = rows, (long)tmp0 < i_1; tmp0 = (ResScalar)((long)tmp0 + 4)) {
    tmp1 = 0.0;
    tmp2 = 0.0;
    tmp3 = 0.0;
    lhs0.m_data = (double *)0x0;
    local_48 = tmp0;
    local_50 = 0;
    local_28 = tmp0;
    local_30 = 0;
    lhs1.m_data = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                  (long)tmp0 * (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
    local_10 = local_38;
    local_90 = (long)tmp0 + (long)iVar3;
    local_98 = 0;
    local_78 = 0;
    lhs2.m_data = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                  local_90 * (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
    local_58 = local_80;
    local_d8 = (long)tmp0 + 2;
    local_e0 = 0;
    local_c0 = 0;
    lhs3.m_data = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                  local_d8 * (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
    local_a0 = local_c8;
    local_120 = (long)tmp0 + (long)iVar4;
    local_128 = 0;
    local_108 = 0;
    local_940 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                local_120 * (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
    local_e8 = local_110;
    local_960 = 0.0;
    local_118 = lhs;
    local_100 = local_120;
    local_f8 = lhs;
    local_f0 = local_940;
    local_d0 = lhs;
    local_b8 = local_d8;
    local_b0 = lhs;
    local_a8 = lhs3.m_data;
    local_88 = lhs;
    local_70 = local_90;
    local_68 = lhs;
    local_60 = lhs2.m_data;
    local_40 = lhs;
    local_20 = lhs;
    local_18 = lhs1.m_data;
    adVar7 = pset1<double__vector(2)>(&local_960);
    unique0x10000577 = extraout_XMM0_Dc;
    auStack_958 = adVar7[0];
    unique0x1000057b = extraout_XMM0_Dd;
    local_980 = 0.0;
    adVar7 = pset1<double__vector(2)>(&local_980);
    unique0x1000059b = extraout_XMM0_Dc_00;
    auStack_978 = adVar7[0];
    unique0x1000059f = extraout_XMM0_Dd_00;
    local_9a0 = 0.0;
    adVar7 = pset1<double__vector(2)>(&local_9a0);
    unique0x100005bf = extraout_XMM0_Dc_01;
    auStack_998 = adVar7[0];
    unique0x100005c3 = extraout_XMM0_Dd_01;
    j = 0;
    adVar7 = pset1<double__vector(2)>((double *)&j);
    unique0x100005e3 = extraout_XMM0_Dc_02;
    auStack_9b8 = adVar7[0];
    unique0x100005e7 = extraout_XMM0_Dd_02;
    for (b = 0.0; (long)b < alignedSize; b = (double)((long)b + 1)) {
      local_200 = b;
      local_208 = 0;
      local_9d0 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data[(long)b];
      local_690 = &lhs1;
      local_698 = b;
      local_9d8 = lhs1.m_data[(long)b];
      local_1f8 = rhs;
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         &local_9d8,&local_9d0);
      tmp1 = dVar1 + tmp1;
      local_6a0 = &lhs2;
      local_6a8 = b;
      local_9e0 = lhs2.m_data[(long)b];
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         &local_9e0,&local_9d0);
      tmp2 = dVar1 + tmp2;
      local_6b0 = &lhs3;
      local_6b8 = b;
      local_9e8 = lhs3.m_data[(long)b];
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         &local_9e8,&local_9d0);
      tmp3 = dVar1 + tmp3;
      local_6c0 = &local_940;
      local_6c8 = b;
      j_1 = (long)local_940[(long)b];
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)&j_1,&local_9d0);
      lhs0.m_data = (double *)(dVar1 + lhs0.m_data);
    }
    if (alignedSize < peeledSize) {
      if (lhsAlignmentOffset == 0) {
        for (b_1[1] = (double)alignedSize; (long)b_1[1] < peeledSize;
            b_1[1] = (double)((long)b_1[1] + 2)) {
          local_740 = b_1[1];
          local_748 = 0;
          local_308 = b_1[1];
          local_310 = 0;
          local_a10 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + (long)b_1[1];
          local_1e8 = local_730;
          local_410 = &local_a10;
          local_418 = 0;
          local_738 = rhs;
          local_408 = local_a10;
          local_300 = rhs;
          local_1f0 = local_a10;
          adVar7 = pload<double__vector(2)>(local_a10);
          unique0x10000cc7 = extraout_XMM0_Dc_03;
          auStack_a08 = adVar7[0];
          unique0x10000ccb = extraout_XMM0_Dd_03;
          local_428 = &lhs1;
          local_430 = b_1[1];
          local_420 = lhs1.m_data + (long)b_1[1];
          adVar7 = pload<double__vector(2)>(local_420);
          local_a28[1]._0_4_ = extraout_XMM0_Dc_04;
          local_a28[0] = adVar7[0];
          local_a28[1]._4_4_ = extraout_XMM0_Dd_04;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_a28,(double (*) [2])auStack_a08,
                           (double (*) [2])auStack_958);
          unique0x10000d0f = extraout_XMM0_Dc_05;
          auStack_958 = adVar8[0];
          unique0x10000d13 = extraout_XMM0_Dd_05;
          local_440 = &lhs2;
          local_448 = b_1[1];
          local_438 = lhs2.m_data + (long)b_1[1];
          adVar7 = pload<double__vector(2)>(local_438);
          local_a38[1]._0_4_ = extraout_XMM0_Dc_06;
          local_a38[0] = adVar7[0];
          local_a38[1]._4_4_ = extraout_XMM0_Dd_06;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_a38,(double (*) [2])auStack_a08,
                           (double (*) [2])auStack_978);
          unique0x10000d57 = extraout_XMM0_Dc_07;
          auStack_978 = adVar8[0];
          unique0x10000d5b = extraout_XMM0_Dd_07;
          local_458 = &lhs3;
          local_460 = b_1[1];
          local_450 = lhs3.m_data + (long)b_1[1];
          adVar7 = pload<double__vector(2)>(local_450);
          local_a48[1]._0_4_ = extraout_XMM0_Dc_08;
          local_a48[0] = adVar7[0];
          local_a48[1]._4_4_ = extraout_XMM0_Dd_08;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_a48,(double (*) [2])auStack_a08,
                           (double (*) [2])auStack_998);
          unique0x10000d9f = extraout_XMM0_Dc_09;
          auStack_998 = adVar8[0];
          unique0x10000da3 = extraout_XMM0_Dd_09;
          local_470 = &local_940;
          local_478 = b_1[1];
          local_468 = local_940 + (long)b_1[1];
          adVar7 = pload<double__vector(2)>(local_468);
          unique0x10000dc3 = extraout_XMM0_Dc_10;
          j_2 = adVar7[0];
          unique0x10000dc7 = extraout_XMM0_Dd_10;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])&j_2,
                           (double (*) [2])auStack_a08,(double (*) [2])auStack_9b8);
          unique0x10000de7 = extraout_XMM0_Dc_11;
          auStack_9b8 = adVar8[0];
          unique0x10000deb = extraout_XMM0_Dd_11;
        }
      }
      else if (lhsAlignmentOffset == 1) {
        for (local_a60 = alignedSize; local_a60 < peeledSize; local_a60 = local_a60 + 2) {
          local_760 = local_a60;
          local_768 = 0;
          local_2f0 = local_a60;
          local_2f8 = 0;
          local_a80 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + local_a60;
          local_1d8 = local_750;
          local_488 = &local_a80;
          local_490 = 0;
          local_758 = rhs;
          local_480 = local_a80;
          local_2e8 = rhs;
          local_1e0 = local_a80;
          adVar7 = pload<double__vector(2)>(local_a80);
          unique0x10000b83 = extraout_XMM0_Dc_12;
          auStack_a78 = adVar7[0];
          unique0x10000b87 = extraout_XMM0_Dd_12;
          local_4a0 = &lhs1;
          local_4a8 = local_a60;
          local_498 = lhs1.m_data + local_a60;
          adVar7 = pload<double__vector(2)>(local_498);
          local_a98[1]._0_4_ = extraout_XMM0_Dc_13;
          local_a98[0] = adVar7[0];
          local_a98[1]._4_4_ = extraout_XMM0_Dd_13;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_a98,(double (*) [2])auStack_a78,
                           (double (*) [2])auStack_958);
          unique0x10000bcb = extraout_XMM0_Dc_14;
          auStack_958 = adVar8[0];
          unique0x10000bcf = extraout_XMM0_Dd_14;
          local_320 = &lhs2;
          local_328 = local_a60;
          local_318 = lhs2.m_data + local_a60;
          adVar7 = ploadu<double__vector(2)>(local_318);
          local_aa8[1]._0_4_ = extraout_XMM0_Dc_15;
          local_aa8[0] = adVar7[0];
          local_aa8[1]._4_4_ = extraout_XMM0_Dd_15;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_aa8,(double (*) [2])auStack_a78,
                           (double (*) [2])auStack_978);
          unique0x10000c13 = extraout_XMM0_Dc_16;
          auStack_978 = adVar8[0];
          unique0x10000c17 = extraout_XMM0_Dd_16;
          local_4b8 = &lhs3;
          local_4c0 = local_a60;
          local_4b0 = lhs3.m_data + local_a60;
          adVar7 = pload<double__vector(2)>(local_4b0);
          local_ab8[1]._0_4_ = extraout_XMM0_Dc_17;
          local_ab8[0] = adVar7[0];
          local_ab8[1]._4_4_ = extraout_XMM0_Dd_17;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_ab8,(double (*) [2])auStack_a78,
                           (double (*) [2])auStack_998);
          unique0x10000c5b = extraout_XMM0_Dc_18;
          auStack_998 = adVar8[0];
          unique0x10000c5f = extraout_XMM0_Dd_18;
          local_338 = &local_940;
          local_340 = local_a60;
          local_330 = local_940 + local_a60;
          adVar7 = ploadu<double__vector(2)>(local_330);
          unique0x10000c7f = extraout_XMM0_Dc_19;
          j_3 = adVar7[0];
          unique0x10000c83 = extraout_XMM0_Dd_19;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])&j_3,
                           (double (*) [2])auStack_a78,(double (*) [2])auStack_9b8);
          unique0x10000ca3 = extraout_XMM0_Dc_20;
          auStack_9b8 = adVar8[0];
          unique0x10000ca7 = extraout_XMM0_Dd_20;
        }
      }
      else if (lhsAlignmentOffset == 2) {
        local_ad0 = alignedSize;
        local_4d8 = alignedSize + -1;
        local_4d0 = &lhs2;
        local_4c8 = lhs2.m_data + local_4d8;
        adVar7 = pload<double__vector(2)>(local_4c8);
        unique0x1000074b = extraout_XMM0_Dc_21;
        A02[1] = adVar7[0];
        unique0x1000074f = extraout_XMM0_Dd_21;
        local_4f0 = alignedSize + -2;
        local_4e8 = &lhs3;
        local_4e0 = lhs3.m_data + local_4f0;
        adVar7 = pload<double__vector(2)>(local_4e0);
        unique0x1000076f = extraout_XMM0_Dc_22;
        A03[1] = adVar7[0];
        unique0x10000773 = extraout_XMM0_Dd_22;
        local_508 = alignedSize + -3;
        local_500 = &local_940;
        local_4f8 = local_940 + local_508;
        adVar7 = pload<double__vector(2)>(local_4f8);
        unique0x10000793 = extraout_XMM0_Dc_23;
        A11[1] = adVar7[0];
        unique0x10000797 = extraout_XMM0_Dd_23;
        for (; local_ad0 < alignmentStep; local_ad0 = local_ad0 + 4) {
          local_780 = local_ad0;
          local_788 = 0;
          local_2d8 = local_ad0;
          local_2e0 = 0;
          local_b50 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + local_ad0;
          local_1c8 = local_770;
          local_518 = &local_b50;
          local_520 = 0;
          local_778 = rhs;
          local_510 = local_b50;
          local_2d0 = rhs;
          local_1d0 = local_b50;
          adVar7 = pload<double__vector(2)>(local_b50);
          unique0x100007b7 = extraout_XMM0_Dc_24;
          auStack_b48 = adVar7[0];
          unique0x100007bb = extraout_XMM0_Dd_24;
          local_538 = local_ad0 + 1;
          local_530 = &lhs2;
          local_528 = lhs2.m_data + local_538;
          adVar7 = pload<double__vector(2)>(local_528);
          unique0x100007db = extraout_XMM0_Dc_25;
          A12[1] = adVar7[0];
          unique0x100007df = extraout_XMM0_Dd_25;
          palign<1,double__vector(2)>((double (*) [2])(A02 + 1),(double (*) [2])(A12 + 1));
          local_548 = &lhs3;
          local_550 = local_ad0;
          local_540 = lhs3.m_data + local_ad0;
          adVar7 = pload<double__vector(2)>(local_540);
          unique0x100007ff = extraout_XMM0_Dc_26;
          A13[1] = adVar7[0];
          unique0x10000803 = extraout_XMM0_Dd_26;
          palign<2,double__vector(2)>((double (*) [2])(A03 + 1),(double (*) [2])(A13 + 1));
          local_568 = local_ad0 + -1;
          local_560 = &local_940;
          local_558 = local_940 + local_568;
          adVar7 = pload<double__vector(2)>(local_558);
          unique0x10000823 = extraout_XMM0_Dc_27;
          b_3[1] = adVar7[0];
          unique0x10000827 = extraout_XMM0_Dd_27;
          palign<3,double__vector(2)>((double (*) [2])(A11 + 1),(double (*) [2])(b_3 + 1));
          local_578 = &lhs1;
          local_580 = local_ad0;
          local_570 = lhs1.m_data + local_ad0;
          adVar7 = pload<double__vector(2)>(local_570);
          local_b68[1]._0_4_ = extraout_XMM0_Dc_28;
          local_b68[0] = adVar7[0];
          local_b68[1]._4_4_ = extraout_XMM0_Dd_28;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_b68,(double (*) [2])auStack_b48,
                           (double (*) [2])auStack_958);
          unique0x1000086b = extraout_XMM0_Dc_29;
          auStack_958 = adVar8[0];
          unique0x1000086f = extraout_XMM0_Dd_29;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])(A02 + 1),
                           (double (*) [2])auStack_b48,(double (*) [2])auStack_978);
          unique0x1000088f = extraout_XMM0_Dc_30;
          auStack_978 = adVar8[0];
          unique0x10000893 = extraout_XMM0_Dd_30;
          local_598 = local_ad0 + 3;
          local_590 = &lhs2;
          local_588 = lhs2.m_data + local_598;
          adVar7 = pload<double__vector(2)>(local_588);
          unique0x100008b3 = extraout_XMM0_Dc_31;
          A02[1] = adVar7[0];
          unique0x100008b7 = extraout_XMM0_Dd_31;
          palign<1,double__vector(2)>((double (*) [2])(A12 + 1),(double (*) [2])(A02 + 1));
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])(A03 + 1),
                           (double (*) [2])auStack_b48,(double (*) [2])auStack_998);
          unique0x100008d7 = extraout_XMM0_Dc_32;
          auStack_998 = adVar8[0];
          unique0x100008db = extraout_XMM0_Dd_32;
          local_5b0 = local_ad0 + 2;
          local_5a8 = &lhs3;
          local_5a0 = lhs3.m_data + local_5b0;
          adVar7 = pload<double__vector(2)>(local_5a0);
          unique0x100008fb = extraout_XMM0_Dc_33;
          A03[1] = adVar7[0];
          unique0x100008ff = extraout_XMM0_Dd_33;
          palign<2,double__vector(2)>((double (*) [2])(A13 + 1),(double (*) [2])(A03 + 1));
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])(A11 + 1),
                           (double (*) [2])auStack_b48,(double (*) [2])auStack_9b8);
          unique0x1000091f = extraout_XMM0_Dc_34;
          auStack_9b8 = adVar8[0];
          unique0x10000923 = extraout_XMM0_Dd_34;
          local_5c8 = local_ad0 + 1;
          local_5c0 = &local_940;
          local_5b8 = local_940 + local_5c8;
          adVar7 = pload<double__vector(2)>(local_5b8);
          unique0x10000943 = extraout_XMM0_Dc_35;
          A11[1] = adVar7[0];
          unique0x10000947 = extraout_XMM0_Dd_35;
          palign<3,double__vector(2)>((double (*) [2])(b_3 + 1),(double (*) [2])(A11 + 1));
          local_7a0 = local_ad0 + 2;
          local_7a8 = 0;
          local_2c8 = 0;
          local_b70 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + local_7a0;
          local_1b8 = local_790;
          local_5d8 = &local_b70;
          local_5e0 = 0;
          local_798 = rhs;
          local_5d0 = local_b70;
          local_2c0 = local_7a0;
          local_2b8 = rhs;
          local_1c0 = local_b70;
          adVar7 = pload<double__vector(2)>(local_b70);
          unique0x10000967 = extraout_XMM0_Dc_36;
          auStack_b48 = adVar7[0];
          unique0x1000096b = extraout_XMM0_Dd_36;
          local_5f8 = local_ad0 + 2;
          local_5f0 = &lhs1;
          local_5e8 = lhs1.m_data + local_5f8;
          adVar7 = pload<double__vector(2)>(local_5e8);
          unique0x1000098b = extraout_XMM0_Dc_37;
          b_4[1] = adVar7[0];
          unique0x1000098f = extraout_XMM0_Dd_37;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])(b_4 + 1),
                           (double (*) [2])auStack_b48,(double (*) [2])auStack_958);
          unique0x100009af = extraout_XMM0_Dc_38;
          auStack_958 = adVar8[0];
          unique0x100009b3 = extraout_XMM0_Dd_38;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])(A12 + 1),
                           (double (*) [2])auStack_b48,(double (*) [2])auStack_978);
          unique0x100009d3 = extraout_XMM0_Dc_39;
          auStack_978 = adVar8[0];
          unique0x100009d7 = extraout_XMM0_Dd_39;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])(A13 + 1),
                           (double (*) [2])auStack_b48,(double (*) [2])auStack_998);
          unique0x100009f7 = extraout_XMM0_Dc_40;
          auStack_998 = adVar8[0];
          unique0x100009fb = extraout_XMM0_Dd_40;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])(b_3 + 1),
                           (double (*) [2])auStack_b48,(double (*) [2])auStack_9b8);
          unique0x10000a1b = extraout_XMM0_Dc_41;
          auStack_9b8 = adVar8[0];
          unique0x10000a1f = extraout_XMM0_Dd_41;
        }
        for (; local_ad0 < peeledSize; local_ad0 = local_ad0 + 2) {
          local_7c0 = local_ad0;
          local_7c8 = 0;
          local_2a8 = local_ad0;
          local_2b0 = 0;
          local_ba0 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + local_ad0;
          local_1a8 = local_7b0;
          local_608 = &local_ba0;
          local_610 = 0;
          local_7b8 = rhs;
          local_600 = local_ba0;
          local_2a0 = rhs;
          local_1b0 = local_ba0;
          adVar7 = pload<double__vector(2)>(local_ba0);
          unique0x10000a3f = extraout_XMM0_Dc_42;
          auStack_b98 = adVar7[0];
          unique0x10000a43 = extraout_XMM0_Dd_42;
          local_620 = &lhs1;
          local_628 = local_ad0;
          local_618 = lhs1.m_data + local_ad0;
          adVar7 = pload<double__vector(2)>(local_618);
          local_bb8[1]._0_4_ = extraout_XMM0_Dc_43;
          local_bb8[0] = adVar7[0];
          local_bb8[1]._4_4_ = extraout_XMM0_Dd_43;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_bb8,(double (*) [2])auStack_b98,
                           (double (*) [2])auStack_958);
          unique0x10000a87 = extraout_XMM0_Dc_44;
          auStack_958 = adVar8[0];
          unique0x10000a8b = extraout_XMM0_Dd_44;
          local_350 = &lhs2;
          local_358 = local_ad0;
          local_348 = lhs2.m_data + local_ad0;
          adVar7 = ploadu<double__vector(2)>(local_348);
          local_bc8[1]._0_4_ = extraout_XMM0_Dc_45;
          local_bc8[0] = adVar7[0];
          local_bc8[1]._4_4_ = extraout_XMM0_Dd_45;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_bc8,(double (*) [2])auStack_b98,
                           (double (*) [2])auStack_978);
          unique0x10000acf = extraout_XMM0_Dc_46;
          auStack_978 = adVar8[0];
          unique0x10000ad3 = extraout_XMM0_Dd_46;
          local_368 = &lhs3;
          local_370 = local_ad0;
          local_360 = lhs3.m_data + local_ad0;
          adVar7 = ploadu<double__vector(2)>(local_360);
          local_bd8[1]._0_4_ = extraout_XMM0_Dc_47;
          local_bd8[0] = adVar7[0];
          local_bd8[1]._4_4_ = extraout_XMM0_Dd_47;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_bd8,(double (*) [2])auStack_b98,
                           (double (*) [2])auStack_998);
          unique0x10000b17 = extraout_XMM0_Dc_48;
          auStack_998 = adVar8[0];
          unique0x10000b1b = extraout_XMM0_Dd_48;
          local_380 = &local_940;
          local_388 = local_ad0;
          local_378 = local_940 + local_ad0;
          adVar7 = ploadu<double__vector(2)>(local_378);
          unique0x10000b3b = extraout_XMM0_Dc_49;
          j_4 = adVar7[0];
          unique0x10000b3f = extraout_XMM0_Dd_49;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])&j_4,
                           (double (*) [2])auStack_b98,(double (*) [2])auStack_9b8);
          unique0x10000b5f = extraout_XMM0_Dc_50;
          auStack_9b8 = adVar8[0];
          unique0x10000b63 = extraout_XMM0_Dd_50;
        }
      }
      else {
        for (local_bf0 = alignedSize; local_bf0 < peeledSize; local_bf0 = local_bf0 + 2) {
          local_7e0 = local_bf0;
          local_7e8 = 0;
          local_290 = local_bf0;
          local_298 = 0;
          local_c10 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + local_bf0;
          local_198 = local_7d0;
          local_638 = &local_c10;
          local_640 = 0;
          local_7d8 = rhs;
          local_630 = local_c10;
          local_288 = rhs;
          local_1a0 = local_c10;
          adVar7 = pload<double__vector(2)>(local_c10);
          unique0x10000607 = extraout_XMM0_Dc_51;
          auStack_c08 = adVar7[0];
          unique0x1000060b = extraout_XMM0_Dd_51;
          local_398 = &lhs1;
          local_3a0 = local_bf0;
          local_390 = lhs1.m_data + local_bf0;
          adVar7 = ploadu<double__vector(2)>(local_390);
          local_c28[1]._0_4_ = extraout_XMM0_Dc_52;
          local_c28[0] = adVar7[0];
          local_c28[1]._4_4_ = extraout_XMM0_Dd_52;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_c28,(double (*) [2])auStack_c08,
                           (double (*) [2])auStack_958);
          unique0x1000064f = extraout_XMM0_Dc_53;
          auStack_958 = adVar8[0];
          unique0x10000653 = extraout_XMM0_Dd_53;
          local_3b0 = &lhs2;
          local_3b8 = local_bf0;
          local_3a8 = lhs2.m_data + local_bf0;
          adVar7 = ploadu<double__vector(2)>(local_3a8);
          local_c38[1]._0_4_ = extraout_XMM0_Dc_54;
          local_c38[0] = adVar7[0];
          local_c38[1]._4_4_ = extraout_XMM0_Dd_54;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_c38,(double (*) [2])auStack_c08,
                           (double (*) [2])auStack_978);
          unique0x10000697 = extraout_XMM0_Dc_55;
          auStack_978 = adVar8[0];
          unique0x1000069b = extraout_XMM0_Dd_55;
          local_3c8 = &lhs3;
          local_3d0 = local_bf0;
          local_3c0 = lhs3.m_data + local_bf0;
          adVar7 = ploadu<double__vector(2)>(local_3c0);
          local_c48[1]._0_4_ = extraout_XMM0_Dc_56;
          local_c48[0] = adVar7[0];
          local_c48[1]._4_4_ = extraout_XMM0_Dd_56;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),&local_c48,(double (*) [2])auStack_c08,
                           (double (*) [2])auStack_998);
          unique0x100006df = extraout_XMM0_Dc_57;
          auStack_998 = adVar8[0];
          unique0x100006e3 = extraout_XMM0_Dd_57;
          local_3e0 = &local_940;
          local_3e8 = local_bf0;
          local_3d8 = local_940 + local_bf0;
          adVar7 = ploadu<double__vector(2)>(local_3d8);
          unique0x10000703 = extraout_XMM0_Dc_58;
          j_5 = adVar7[0];
          unique0x10000707 = extraout_XMM0_Dd_58;
          adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                   ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                            *)((long)&rowsAtOnce + 6),(double (*) [2])&j_5,
                           (double (*) [2])auStack_c08,(double (*) [2])auStack_9b8);
          unique0x10000727 = extraout_XMM0_Dc_59;
          auStack_9b8 = adVar8[0];
          unique0x1000072b = extraout_XMM0_Dd_59;
        }
      }
      dVar1 = predux<double__vector(2)>((Packet2d *)auStack_958);
      tmp1 = dVar1 + tmp1;
      dVar1 = predux<double__vector(2)>((Packet2d *)auStack_978);
      tmp2 = dVar1 + tmp2;
      dVar1 = predux<double__vector(2)>((Packet2d *)auStack_998);
      tmp3 = dVar1 + tmp3;
      dVar1 = predux<double__vector(2)>((Packet2d *)auStack_9b8);
      lhs0.m_data = (double *)(dVar1 + lhs0.m_data);
    }
    for (b_6 = (double)peeledSize; (long)b_6 < lhsStride; b_6 = (double)((long)b_6 + 1)) {
      local_218 = b_6;
      local_220 = 0;
      local_c68 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data[(long)b_6];
      local_6d0 = &lhs1;
      local_6d8 = b_6;
      local_c70 = lhs1.m_data[(long)b_6];
      local_210 = rhs;
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         &local_c70,&local_c68);
      tmp1 = dVar1 + tmp1;
      local_6e0 = &lhs2;
      local_6e8 = b_6;
      local_c78 = lhs2.m_data[(long)b_6];
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         &local_c78,&local_c68);
      tmp2 = dVar1 + tmp2;
      local_6f0 = &lhs3;
      local_6f8 = b_6;
      local_c80 = lhs3.m_data[(long)b_6];
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         &local_c80,&local_c68);
      tmp3 = dVar1 + tmp3;
      local_700 = &local_940;
      local_708 = b_6;
      end = (long)local_940[(long)b_6];
      dVar1 = conj_helper<double,_double,_false,_false>::pmul
                        ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                         (double *)&end,&local_c68);
      lhs0.m_data = (double *)(dVar1 + lhs0.m_data);
    }
    res[(long)tmp0 * resIncr] = RStack_860 * tmp1 + res[(long)tmp0 * resIncr];
    lVar6 = ((long)tmp0 + (long)iVar3) * resIncr;
    res[lVar6] = RStack_860 * tmp2 + res[lVar6];
    lVar6 = ((long)tmp0 + 2) * resIncr;
    res[lVar6] = RStack_860 * tmp3 + res[lVar6];
    lVar6 = ((long)tmp0 + (long)iVar4) * resIncr;
    res[lVar6] = RStack_860 * (double)lhs0.m_data + res[lVar6];
  }
  while( true ) {
    for (tmp0_1 = (ResScalar)i_1; (long)tmp0_1 < start; tmp0_1 = (ResScalar)((long)tmp0_1 + 1)) {
      ptmp0_1[1] = 0.0;
      adVar7 = pset1<double__vector(2)>(ptmp0_1 + 1);
      unique0x10000e0b = extraout_XMM0_Dc_60;
      lhs0_1.m_data = adVar7[0];
      unique0x10000e0f = extraout_XMM0_Dd_60;
      local_168 = tmp0_1;
      local_170 = 0;
      local_148 = tmp0_1;
      local_150 = 0;
      j_6 = (long)((lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data +
                  (long)tmp0_1 * (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride);
      local_130 = local_158;
      local_160 = lhs;
      local_140 = lhs;
      local_138 = (double *)j_6;
      for (local_cc8 = 0; local_cc8 < alignedSize; local_cc8 = local_cc8 + 1) {
        local_710 = &j_6;
        local_718 = local_cc8;
        j_7 = *(long *)(j_6 + local_cc8 * 8);
        local_230 = local_cc8;
        local_238 = 0;
        local_228 = rhs;
        dVar1 = conj_helper<double,_double,_false,_false>::pmul
                          ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                           (double *)&j_7,
                           (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                           local_cc8);
        ptmp0_1[1] = dVar1 + ptmp0_1[1];
      }
      if (alignedSize < peeledSize) {
        bVar2 = BlasVectorMapper<double_const,long>::aligned<double__vector(2)>
                          ((BlasVectorMapper<double_const,long> *)&j_6,alignedSize);
        if (bVar2) {
          for (local_cd8 = alignedSize; local_cd8 < peeledSize; local_cd8 = local_cd8 + 2) {
            local_650 = &j_6;
            local_658 = local_cd8;
            local_648 = (double *)(j_6 + local_cd8 * 8);
            adVar7 = pload<double__vector(2)>(local_648);
            local_ce8[1]._0_4_ = extraout_XMM0_Dc_61;
            local_ce8[0] = adVar7[0];
            local_ce8[1]._4_4_ = extraout_XMM0_Dd_61;
            local_800 = local_cd8;
            local_808 = 0;
            local_278 = local_cd8;
            local_280 = 0;
            j_8 = (long)((rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + local_cd8)
            ;
            local_188 = local_7f0;
            local_668 = &j_8;
            local_670 = 0;
            local_7f8 = rhs;
            local_660 = (double *)j_8;
            local_270 = rhs;
            local_190 = (double *)j_8;
            adVar7 = pload<double__vector(2)>((double *)j_8);
            local_cf8[1]._0_4_ = extraout_XMM0_Dc_62;
            local_cf8[0] = adVar7[0];
            local_cf8[1]._4_4_ = extraout_XMM0_Dd_62;
            adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                     ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                              *)((long)&rowsAtOnce + 6),&local_ce8,&local_cf8,
                             (double (*) [2])&lhs0_1);
            unique0x10000ee3 = extraout_XMM0_Dc_63;
            lhs0_1.m_data = adVar8[0];
            unique0x10000ee7 = extraout_XMM0_Dd_63;
          }
        }
        else {
          for (local_d08 = alignedSize; local_d08 < peeledSize; local_d08 = local_d08 + 2) {
            local_3f8 = &j_6;
            local_400 = local_d08;
            local_3f0 = (double *)(j_6 + local_d08 * 8);
            adVar7 = ploadu<double__vector(2)>(local_3f0);
            local_d18[1]._0_4_ = extraout_XMM0_Dc_64;
            local_d18[0] = adVar7[0];
            local_d18[1]._4_4_ = extraout_XMM0_Dd_64;
            local_260 = local_d08;
            local_268 = 0;
            j_9 = (long)((rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data + local_d08)
            ;
            local_178 = local_810;
            local_680 = &j_9;
            local_688 = 0;
            local_678 = (double *)j_9;
            local_258 = rhs;
            local_180 = (double *)j_9;
            adVar7 = pload<double__vector(2)>((double *)j_9);
            local_d28[1]._0_4_ = extraout_XMM0_Dc_65;
            local_d28[0] = adVar7[0];
            local_d28[1]._4_4_ = extraout_XMM0_Dd_65;
            adVar8 = conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                     ::pmadd((conj_helper<__attribute__((__vector_size__(2_*_sizeof(double))))_double,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_false,_false>
                              *)((long)&rowsAtOnce + 6),&local_d18,&local_d28,
                             (double (*) [2])&lhs0_1);
            unique0x10000e77 = extraout_XMM0_Dc_66;
            lhs0_1.m_data = adVar8[0];
            unique0x10000e7b = extraout_XMM0_Dd_66;
          }
        }
        dVar1 = predux<double__vector(2)>((Packet2d *)&lhs0_1);
        ptmp0_1[1] = dVar1 + ptmp0_1[1];
      }
      for (local_d38 = peeledSize; local_d38 < lhsStride; local_d38 = local_d38 + 1) {
        local_720 = &j_6;
        local_728 = local_d38;
        local_d40 = *(double *)(j_6 + local_d38 * 8);
        local_248 = local_d38;
        local_250 = 0;
        local_240 = rhs;
        dVar1 = conj_helper<double,_double,_false,_false>::pmul
                          ((conj_helper<double,_double,_false,_false> *)((long)&rowsAtOnce + 7),
                           &local_d40,
                           (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                           local_d38);
        ptmp0_1[1] = dVar1 + ptmp0_1[1];
      }
      res[(long)tmp0_1 * resIncr] = RStack_860 * ptmp0_1[1] + res[(long)tmp0_1 * resIncr];
    }
    if (local_8d8 == 0.0) break;
    i_1 = 0;
    start = (long)local_8d8;
    local_8d8 = 0.0;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& lhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  eigen_internal_assert(rhs.stride()==1);

  #ifdef _EIGEN_ACCUMULATE_PACKETS
  #error _EIGEN_ACCUMULATE_PACKETS has already been defined
  #endif

  #define _EIGEN_ACCUMULATE_PACKETS(Alignment0,Alignment13,Alignment2) {\
    RhsPacket b = rhs.getVectorMapper(j, 0).template load<RhsPacket, Aligned>(0);  \
    ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Alignment0>(j), b, ptmp0); \
    ptmp1 = pcj.pmadd(lhs1.template load<LhsPacket, Alignment13>(j), b, ptmp1); \
    ptmp2 = pcj.pmadd(lhs2.template load<LhsPacket, Alignment2>(j), b, ptmp2); \
    ptmp3 = pcj.pmadd(lhs3.template load<LhsPacket, Alignment13>(j), b, ptmp3); }

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  typedef typename LhsMapper::VectorMapper LhsScalars;

  enum { AllAligned=0, EvenAligned=1, FirstAligned=2, NoneAligned=3 };
  const Index rowsAtOnce = 4;
  const Index peels = 2;
  const Index RhsPacketAlignedMask = RhsPacketSize-1;
  const Index LhsPacketAlignedMask = LhsPacketSize-1;
  const Index depth = cols;
  const Index lhsStride = lhs.stride();

  // How many coeffs of the result do we have to skip to be aligned.
  // Here we assume data are at least aligned on the base scalar type
  // if that's not the case then vectorization is discarded, see below.
  Index alignedStart = rhs.firstAligned(depth);
  Index alignedSize = RhsPacketSize>1 ? alignedStart + ((depth-alignedStart) & ~RhsPacketAlignedMask) : 0;
  const Index peeledSize = alignedSize - RhsPacketSize*peels - RhsPacketSize + 1;

  const Index alignmentStep = LhsPacketSize>1 ? (LhsPacketSize - lhsStride % LhsPacketSize) & LhsPacketAlignedMask : 0;
  Index alignmentPattern = alignmentStep==0 ? AllAligned
                           : alignmentStep==(LhsPacketSize/2) ? EvenAligned
                           : FirstAligned;

  // we cannot assume the first element is aligned because of sub-matrices
  const Index lhsAlignmentOffset = lhs.firstAligned(depth);
  const Index rhsAlignmentOffset = rhs.firstAligned(rows);

  // find how many rows do we have to skip to be aligned with rhs (if possible)
  Index skipRows = 0;
  // if the data cannot be aligned (TODO add some compile time tests when possible, e.g. for floats)
  if( (sizeof(LhsScalar)!=sizeof(RhsScalar)) ||
      (lhsAlignmentOffset < 0) || (lhsAlignmentOffset == depth) ||
      (rhsAlignmentOffset < 0) || (rhsAlignmentOffset == rows) )
  {
    alignedSize = 0;
    alignedStart = 0;
    alignmentPattern = NoneAligned;
  }
  else if(LhsPacketSize > 4)
  {
    // TODO: extend the code to support aligned loads whenever possible when LhsPacketSize > 4.
    alignmentPattern = NoneAligned;
  }
  else if (LhsPacketSize>1)
  {
  //    eigen_internal_assert(size_t(firstLhs+lhsAlignmentOffset)%sizeof(LhsPacket)==0  || depth<LhsPacketSize);

    while (skipRows<LhsPacketSize &&
           alignedStart != ((lhsAlignmentOffset + alignmentStep*skipRows)%LhsPacketSize))
      ++skipRows;
    if (skipRows==LhsPacketSize)
    {
      // nothing can be aligned, no need to skip any column
      alignmentPattern = NoneAligned;
      skipRows = 0;
    }
    else
    {
      skipRows = (std::min)(skipRows,Index(rows));
      // note that the skiped columns are processed later.
    }
    /*    eigen_internal_assert(  alignmentPattern==NoneAligned
                      || LhsPacketSize==1
                      || (skipRows + rowsAtOnce >= rows)
                      || LhsPacketSize > depth
                      || (size_t(firstLhs+alignedStart+lhsStride*skipRows)%sizeof(LhsPacket))==0);*/
  }
  else if(Vectorizable)
  {
    alignedStart = 0;
    alignedSize = depth;
    alignmentPattern = AllAligned;
  }

  const Index offset1 = (alignmentPattern==FirstAligned && alignmentStep==1)?3:1;
  const Index offset3 = (alignmentPattern==FirstAligned && alignmentStep==1)?1:3;

  Index rowBound = ((rows-skipRows)/rowsAtOnce)*rowsAtOnce + skipRows;
  for (Index i=skipRows; i<rowBound; i+=rowsAtOnce)
  {
    // FIXME: what is the purpose of this EIGEN_ALIGN_DEFAULT ??
    EIGEN_ALIGN_MAX ResScalar tmp0 = ResScalar(0);
    ResScalar tmp1 = ResScalar(0), tmp2 = ResScalar(0), tmp3 = ResScalar(0);

    // this helps the compiler generating good binary code
    const LhsScalars lhs0 = lhs.getVectorMapper(i+0, 0),    lhs1 = lhs.getVectorMapper(i+offset1, 0),
                     lhs2 = lhs.getVectorMapper(i+2, 0),    lhs3 = lhs.getVectorMapper(i+offset3, 0);

    if (Vectorizable)
    {
      /* explicit vectorization */
      ResPacket ptmp0 = pset1<ResPacket>(ResScalar(0)), ptmp1 = pset1<ResPacket>(ResScalar(0)),
                ptmp2 = pset1<ResPacket>(ResScalar(0)), ptmp3 = pset1<ResPacket>(ResScalar(0));

      // process initial unaligned coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
      {
        RhsScalar b = rhs(j, 0);
        tmp0 += cj.pmul(lhs0(j),b); tmp1 += cj.pmul(lhs1(j),b);
        tmp2 += cj.pmul(lhs2(j),b); tmp3 += cj.pmul(lhs3(j),b);
      }

      if (alignedSize>alignedStart)
      {
        switch(alignmentPattern)
        {
          case AllAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(Aligned,Aligned,Aligned);
            break;
          case EvenAligned:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(Aligned,Unaligned,Aligned);
            break;
          case FirstAligned:
          {
            Index j = alignedStart;
            if (peels>1)
            {
              /* Here we proccess 4 rows with with two peeled iterations to hide
               * the overhead of unaligned loads. Moreover unaligned loads are handled
               * using special shift/move operations between the two aligned packets
               * overlaping the desired unaligned packet. This is *much* more efficient
               * than basic unaligned loads.
               */
              LhsPacket A01, A02, A03, A11, A12, A13;
              A01 = lhs1.template load<LhsPacket, Aligned>(alignedStart-1);
              A02 = lhs2.template load<LhsPacket, Aligned>(alignedStart-2);
              A03 = lhs3.template load<LhsPacket, Aligned>(alignedStart-3);

              for (; j<peeledSize; j+=peels*RhsPacketSize)
              {
                RhsPacket b = rhs.getVectorMapper(j, 0).template load<RhsPacket, Aligned>(0);
                A11 = lhs1.template load<LhsPacket, Aligned>(j-1+LhsPacketSize);  palign<1>(A01,A11);
                A12 = lhs2.template load<LhsPacket, Aligned>(j-2+LhsPacketSize);  palign<2>(A02,A12);
                A13 = lhs3.template load<LhsPacket, Aligned>(j-3+LhsPacketSize);  palign<3>(A03,A13);

                ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Aligned>(j), b, ptmp0);
                ptmp1 = pcj.pmadd(A01, b, ptmp1);
                A01 = lhs1.template load<LhsPacket, Aligned>(j-1+2*LhsPacketSize);  palign<1>(A11,A01);
                ptmp2 = pcj.pmadd(A02, b, ptmp2);
                A02 = lhs2.template load<LhsPacket, Aligned>(j-2+2*LhsPacketSize);  palign<2>(A12,A02);
                ptmp3 = pcj.pmadd(A03, b, ptmp3);
                A03 = lhs3.template load<LhsPacket, Aligned>(j-3+2*LhsPacketSize);  palign<3>(A13,A03);

                b = rhs.getVectorMapper(j+RhsPacketSize, 0).template load<RhsPacket, Aligned>(0);
                ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Aligned>(j+LhsPacketSize), b, ptmp0);
                ptmp1 = pcj.pmadd(A11, b, ptmp1);
                ptmp2 = pcj.pmadd(A12, b, ptmp2);
                ptmp3 = pcj.pmadd(A13, b, ptmp3);
              }
            }
            for (; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(Aligned,Unaligned,Unaligned);
            break;
          }
          default:
            for (Index j = alignedStart; j<alignedSize; j+=RhsPacketSize)
              _EIGEN_ACCUMULATE_PACKETS(Unaligned,Unaligned,Unaligned);
            break;
        }
        tmp0 += predux(ptmp0);
        tmp1 += predux(ptmp1);
        tmp2 += predux(ptmp2);
        tmp3 += predux(ptmp3);
      }
    } // end explicit vectorization

    // process remaining coeffs (or all if no explicit vectorization)
    // FIXME this loop get vectorized by the compiler !
    for (Index j=alignedSize; j<depth; ++j)
    {
      RhsScalar b = rhs(j, 0);
      tmp0 += cj.pmul(lhs0(j),b); tmp1 += cj.pmul(lhs1(j),b);
      tmp2 += cj.pmul(lhs2(j),b); tmp3 += cj.pmul(lhs3(j),b);
    }
    res[i*resIncr]            += alpha*tmp0;
    res[(i+offset1)*resIncr]  += alpha*tmp1;
    res[(i+2)*resIncr]        += alpha*tmp2;
    res[(i+offset3)*resIncr]  += alpha*tmp3;
  }

  // process remaining first and last rows (at most columnsAtOnce-1)
  Index end = rows;
  Index start = rowBound;
  do
  {
    for (Index i=start; i<end; ++i)
    {
      EIGEN_ALIGN_MAX ResScalar tmp0 = ResScalar(0);
      ResPacket ptmp0 = pset1<ResPacket>(tmp0);
      const LhsScalars lhs0 = lhs.getVectorMapper(i, 0);
      // process first unaligned result's coeffs
      // FIXME this loop get vectorized by the compiler !
      for (Index j=0; j<alignedStart; ++j)
        tmp0 += cj.pmul(lhs0(j), rhs(j, 0));

      if (alignedSize>alignedStart)
      {
        // process aligned rhs coeffs
        if (lhs0.template aligned<LhsPacket>(alignedStart))
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Aligned>(j), rhs.getVectorMapper(j, 0).template load<RhsPacket, Aligned>(0), ptmp0);
        else
          for (Index j = alignedStart;j<alignedSize;j+=RhsPacketSize)
            ptmp0 = pcj.pmadd(lhs0.template load<LhsPacket, Unaligned>(j), rhs.getVectorMapper(j, 0).template load<RhsPacket, Aligned>(0), ptmp0);
        tmp0 += predux(ptmp0);
      }

      // process remaining scalars
      // FIXME this loop get vectorized by the compiler !
      for (Index j=alignedSize; j<depth; ++j)
        tmp0 += cj.pmul(lhs0(j), rhs(j, 0));
      res[i*resIncr] += alpha*tmp0;
    }
    if (skipRows)
    {
      start = 0;
      end = skipRows;
      skipRows = 0;
    }
    else
      break;
  } while(Vectorizable);

  #undef _EIGEN_ACCUMULATE_PACKETS
}